

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

SliceDynamicLayerParams * __thiscall
CoreML::Specification::SliceDynamicLayerParams::New(SliceDynamicLayerParams *this,Arena *arena)

{
  SliceDynamicLayerParams *this_00;
  SliceDynamicLayerParams *n;
  Arena *arena_local;
  SliceDynamicLayerParams *this_local;
  
  this_00 = (SliceDynamicLayerParams *)operator_new(0x88);
  SliceDynamicLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SliceDynamicLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SliceDynamicLayerParams* SliceDynamicLayerParams::New(::google::protobuf::Arena* arena) const {
  SliceDynamicLayerParams* n = new SliceDynamicLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}